

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPServer::get_prop
          (CVmObjHTTPServer *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  uint uVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  code *pcVar4;
  long *plVar5;
  
  uVar1 = CVmMetaTable::prop_to_vector_idx(G_meta_table_X,metaclass_reg_->meta_reg_idx_,prop);
  pcVar4 = (code *)func_table_[(ulong)uVar1 * 2];
  plVar5 = (long *)((long)&(this->super_CVmObject)._vptr_CVmObject +
                   func_table_[(ulong)uVar1 * 2 + 1]);
  if (((ulong)pcVar4 & 1) != 0) {
    pcVar4 = *(code **)(pcVar4 + *plVar5 + -1);
  }
  iVar2 = (*pcVar4)(plVar5,self,retval,argc);
  if (iVar2 != 0) {
    vVar3 = CVmMetaclass::get_class_obj(metaclass_reg_);
    *source_obj = vVar3;
    return 1;
  }
  iVar2 = CVmObject::get_prop(&this->super_CVmObject,prop,retval,self,source_obj,argc);
  return iVar2;
}

Assistant:

int CVmObjHTTPServer::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                               vm_obj_id_t self, vm_obj_id_t *source_obj,
                               uint *argc)
{
    uint func_idx;
    
    /* translate the property into a function vector index */
    func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);
    
    /* call the appropriate function */
    if ((this->*func_table_[func_idx])(vmg_ self, retval, argc))
    {
        *source_obj = metaclass_reg_->get_class_obj(vmg0_);
        return TRUE;
    }
    
    /* inherit default handling from our base class */
    return CVmObject::get_prop(vmg_ prop, retval, self, source_obj, argc);
}